

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSModuleDef * js_module_loader(JSContext *ctx,char *module_name,void *opaque)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  code *pcVar6;
  JSModuleDef *pJVar7;
  uint8_t *input;
  JSValueUnion JVar8;
  int64_t extraout_RDX;
  JSValue func_val;
  JSValue v;
  size_t buf_len;
  size_t local_28;
  
  iVar1 = has_suffix(module_name,".so");
  if (iVar1 == 0) {
    input = js_load_file(ctx,&local_28,module_name);
    if (input == (uint8_t *)0x0) {
      pcVar4 = "could not load module filename \'%s\'";
      goto LAB_0010fb58;
    }
    v = JS_Eval(ctx,(char *)input,local_28,module_name,0x21);
    JVar8 = v.u;
    js_free(ctx,input);
    if ((uint)v.tag != 6) {
      func_val.tag = extraout_RDX;
      func_val.u.ptr = JVar8.ptr;
      js_module_set_import_meta(ctx,func_val,1,0);
      if ((uint)v.tag < 0xfffffff5) {
        return (JSModuleDef *)JVar8.float64;
      }
      iVar1 = *JVar8.ptr;
      *(int *)JVar8.ptr = iVar1 + -1;
      if (iVar1 < 2) {
        __JS_FreeValue(ctx,v);
        return (JSModuleDef *)JVar8.float64;
      }
      return (JSModuleDef *)JVar8.float64;
    }
  }
  else {
    pcVar2 = strchr(module_name,0x2f);
    pcVar4 = module_name;
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(module_name);
      pcVar4 = (char *)js_malloc(ctx,sVar3 + 3);
      if (pcVar4 == (char *)0x0) {
        return (JSModuleDef *)0x0;
      }
      pcVar4[2] = '\0';
      pcVar4[0] = '.';
      pcVar4[1] = '/';
      strcpy(pcVar4 + 2,module_name);
    }
    lVar5 = dlopen(pcVar4,2);
    if (pcVar4 != module_name) {
      js_free(ctx,pcVar4);
    }
    if (lVar5 == 0) {
      pcVar4 = "could not load module filename \'%s\' as shared library";
LAB_0010fb58:
      JS_ThrowReferenceError(ctx,pcVar4,module_name);
      return (JSModuleDef *)0x0;
    }
    pcVar6 = (code *)dlsym(lVar5,"js_init_module");
    if (pcVar6 == (code *)0x0) {
      pcVar4 = "could not load module filename \'%s\': js_init_module not found";
    }
    else {
      pJVar7 = (JSModuleDef *)(*pcVar6)(ctx,module_name);
      if (pJVar7 != (JSModuleDef *)0x0) {
        return pJVar7;
      }
      pcVar4 = "could not load module filename \'%s\': initialization error";
    }
    JS_ThrowReferenceError(ctx,pcVar4,module_name);
    if (lVar5 == 0) {
      return (JSModuleDef *)0x0;
    }
    dlclose(lVar5);
  }
  return (JSModuleDef *)0x0;
}

Assistant:

JSModuleDef *js_module_loader(JSContext *ctx,
                              const char *module_name, void *opaque)
{
    JSModuleDef *m;

    if (has_suffix(module_name, ".so")) {
        m = js_module_loader_so(ctx, module_name);
    } else {
        size_t buf_len;
        uint8_t *buf;
        JSValue func_val;
    
        buf = js_load_file(ctx, &buf_len, module_name);
        if (!buf) {
            JS_ThrowReferenceError(ctx, "could not load module filename '%s'",
                                   module_name);
            return NULL;
        }
        
        /* compile the module */
        func_val = JS_Eval(ctx, (char *)buf, buf_len, module_name,
                           JS_EVAL_TYPE_MODULE | JS_EVAL_FLAG_COMPILE_ONLY);
        js_free(ctx, buf);
        if (JS_IsException(func_val))
            return NULL;
        /* XXX: could propagate the exception */
        js_module_set_import_meta(ctx, func_val, TRUE, FALSE);
        /* the module is already referenced, so we must free it */
        m = JS_VALUE_GET_PTR(func_val);
        JS_FreeValue(ctx, func_val);
    }
    return m;
}